

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O1

void anon_unknown.dwarf_130114::RenderDrawLists(ImDrawData *draw_data)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImDrawList *pIVar5;
  ImDrawVert *pIVar6;
  ImDrawCmd *pIVar7;
  code *pcVar8;
  ImGuiIO *pIVar9;
  int fb_width;
  long lVar10;
  long lVar11;
  int fb_height;
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  GLint last_tex_env_mode;
  GLint last_shade_model;
  GLint last_texture;
  GLint last_polygon_mode [2];
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  unsigned_short *local_38;
  
  ImGui::GetDrawData();
  if (draw_data->CmdListsCount != 0) {
    pIVar9 = ImGui::GetIO();
    if (pIVar9->Fonts->TexID == (ImTextureID)0x0) {
      __assert_fail("io.Fonts->TexID != (ImTextureID)NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-sfml-src/imgui-SFML.cpp"
                    ,0x366,"void (anonymous namespace)::RenderDrawLists(ImDrawData *)");
    }
    fb_width = (int)((draw_data->DisplaySize).x * (draw_data->FramebufferScale).x);
    fb_height = (int)((draw_data->DisplaySize).y * (draw_data->FramebufferScale).y);
    if (fb_height != 0 && fb_width != 0) {
      ImDrawData::ScaleClipRects(draw_data,&pIVar9->DisplayFramebufferScale);
      glGetIntegerv(0x8069,&local_64);
      glGetIntegerv(0xb40,&local_60);
      glGetIntegerv(0xba2,&local_48);
      glGetIntegerv(0xc10,&local_58);
      glGetIntegerv(0xb54,&local_68);
      glGetTexEnviv(0x2300,0x2200,&local_6c);
      glPushAttrib(0x7000);
      SetupRenderState(draw_data,fb_width,fb_height);
      if (0 < draw_data->CmdListsCount) {
        fVar1 = (draw_data->DisplayPos).x;
        fVar2 = (draw_data->DisplayPos).y;
        fVar3 = (draw_data->FramebufferScale).x;
        fVar4 = (draw_data->FramebufferScale).y;
        lVar11 = 0;
        do {
          pIVar5 = draw_data->CmdLists[lVar11];
          local_38 = (pIVar5->IdxBuffer).Data;
          pIVar6 = (pIVar5->VtxBuffer).Data;
          glVertexPointer(2,0x1406,0x14,pIVar6);
          glTexCoordPointer(2,0x1406,0x14,&pIVar6->uv);
          glColorPointer(4,0x1401,0x14,&pIVar6->col);
          if (0 < (pIVar5->CmdBuffer).Size) {
            lVar10 = 0;
            lVar12 = 0;
            do {
              pIVar7 = (pIVar5->CmdBuffer).Data;
              pcVar8 = *(code **)((long)&pIVar7->UserCallback + lVar10);
              if (pcVar8 == (code *)0x0) {
                fVar13 = (*(float *)((long)&(pIVar7->ClipRect).x + lVar10) - fVar1) * fVar3;
                if ((((fVar13 < (float)fb_width) &&
                     (fVar14 = (*(float *)((long)&(pIVar7->ClipRect).y + lVar10) - fVar2) * fVar4,
                     fVar14 < (float)fb_height)) &&
                    (fVar15 = (*(float *)((long)&(pIVar7->ClipRect).z + lVar10) - fVar1) * fVar3,
                    0.0 <= fVar15)) &&
                   (fVar16 = (*(float *)((long)&(pIVar7->ClipRect).w + lVar10) - fVar2) * fVar4,
                   0.0 <= fVar16)) {
                  glScissor((int)fVar13,(int)((float)fb_height - fVar16),(int)(fVar15 - fVar13),
                            (int)(fVar16 - fVar14));
                  glBindTexture(0xde1,*(undefined4 *)((long)&pIVar7->TextureId + lVar10));
                  glDrawElements(4,*(undefined4 *)((long)&pIVar7->ElemCount + lVar10),0x1403,
                                 local_38 + *(uint *)((long)&pIVar7->IdxOffset + lVar10));
                }
              }
              else if (pcVar8 == (code *)0xffffffffffffffff) {
                SetupRenderState(draw_data,fb_width,fb_height);
              }
              else {
                (*pcVar8)(pIVar5,(long)&(pIVar7->ClipRect).x + lVar10);
              }
              lVar12 = lVar12 + 1;
              lVar10 = lVar10 + 0x38;
            } while (lVar12 < (pIVar5->CmdBuffer).Size);
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < draw_data->CmdListsCount);
      }
      glDisableClientState(0x8076);
      glDisableClientState(0x8078);
      glDisableClientState(0x8074);
      glBindTexture(0xde1,local_64);
      glMatrixMode(0x1700);
      glPopMatrix();
      glMatrixMode(0x1701);
      glPopMatrix();
      glPopAttrib();
      glPolygonMode(0x404,local_60);
      glPolygonMode(0x405,local_5c);
      glViewport(local_48,local_44,local_40,local_3c);
      glScissor(local_58,local_54,local_50,local_4c);
      glShadeModel(local_68);
      glTexEnvi(0x2300,0x2200,local_6c);
    }
  }
  return;
}

Assistant:

void RenderDrawLists(ImDrawData* draw_data) {
    ImGui::GetDrawData();
    if (draw_data->CmdListsCount == 0) {
        return;
    }

    ImGuiIO& io = ImGui::GetIO();
    assert(io.Fonts->TexID != (ImTextureID)NULL); // You forgot to create and set font texture

    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates !=
    // framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width == 0 || fb_height == 0) return;
    draw_data->ScaleClipRects(io.DisplayFramebufferScale);

    // Backup GL state
    // Backup GL state
    GLint last_texture;
    glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
    GLint last_polygon_mode[2];
    glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
    GLint last_viewport[4];
    glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4];
    glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLint last_shade_model;
    glGetIntegerv(GL_SHADE_MODEL, &last_shade_model);
    GLint last_tex_env_mode;
    glGetTexEnviv(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, &last_tex_env_mode);

#ifdef GL_VERSION_ES_CL_1_1
    GLint last_array_buffer;
    glGetIntegerv(GL_ARRAY_BUFFER_BINDING, &last_array_buffer);
    GLint last_element_array_buffer;
    glGetIntegerv(GL_ELEMENT_ARRAY_BUFFER_BINDING, &last_element_array_buffer);
#else
    glPushAttrib(GL_ENABLE_BIT | GL_COLOR_BUFFER_BIT | GL_TRANSFORM_BIT);
#endif

    // Setup desired GL state
    SetupRenderState(draw_data, fb_width, fb_height);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos; // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are
                                                     // often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++) {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];
        const ImDrawVert* vtx_buffer = cmd_list->VtxBuffer.Data;
        const ImDrawIdx* idx_buffer = cmd_list->IdxBuffer.Data;
        glVertexPointer(2, GL_FLOAT, sizeof(ImDrawVert),
                        (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, pos)));
        glTexCoordPointer(2, GL_FLOAT, sizeof(ImDrawVert),
                          (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, uv)));
        glColorPointer(4, GL_UNSIGNED_BYTE, sizeof(ImDrawVert),
                       (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, col)));

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++) {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback) {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to
                // request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    SetupRenderState(draw_data, fb_width, fb_height);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            } else {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f &&
                    clip_rect.w >= 0.0f) {
                    // Apply scissor/clipping rectangle
                    glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w),
                              (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));

                    // Bind texture, Draw
                    GLuint textureHandle = convertImTextureIDToGLTextureHandle(pcmd->TextureId);
                    glBindTexture(GL_TEXTURE_2D, textureHandle);
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount,
                                   sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT,
                                   idx_buffer + pcmd->IdxOffset);
                }
            }
        }
    }

    // Restore modified GL state
    glDisableClientState(GL_COLOR_ARRAY);
    glDisableClientState(GL_TEXTURE_COORD_ARRAY);
    glDisableClientState(GL_VERTEX_ARRAY);
    glBindTexture(GL_TEXTURE_2D, (GLuint)last_texture);
    glMatrixMode(GL_MODELVIEW);
    glPopMatrix();
    glMatrixMode(GL_PROJECTION);
    glPopMatrix();
    glPopAttrib();
    glPolygonMode(GL_FRONT, (GLenum)last_polygon_mode[0]);
    glPolygonMode(GL_BACK, (GLenum)last_polygon_mode[1]);
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2],
               (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2],
              (GLsizei)last_scissor_box[3]);
    glShadeModel(last_shade_model);
    glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, last_tex_env_mode);

#ifdef GL_VERSION_ES_CL_1_1
    glBindBuffer(GL_ARRAY_BUFFER, last_array_buffer);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, last_element_array_buffer);
    glDisable(GL_SCISSOR_TEST);
#endif
}